

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ConstHoisting::create(ConstHoisting *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x158);
  memset(__s,0,0x158);
  __s[1] = (_func_int *)0x0;
  __s[2] = (_func_int *)(__s + 4);
  __s[3] = (_func_int *)0x0;
  *(undefined1 *)(__s + 4) = 0;
  __s[6] = (_func_int *)0x0;
  __s[7] = (_func_int *)0x0;
  __s[0x1c] = (_func_int *)0x0;
  __s[0x1d] = (_func_int *)0x0;
  __s[0x1e] = (_func_int *)0x0;
  __s[0x1f] = (_func_int *)0x0;
  __s[0x20] = (_func_int *)0x0;
  *__s = (_func_int *)&PTR__ConstHoisting_00d87f28;
  __s[0x21] = (_func_int *)(__s + 0x27);
  __s[0x22] = (_func_int *)0x1;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  *(undefined4 *)(__s + 0x25) = 0x3f800000;
  __s[0x26] = (_func_int *)0x0;
  __s[0x27] = (_func_int *)0x0;
  __s[0x29] = (_func_int *)(__s + 0x28);
  __s[0x28] = (_func_int *)(__s + 0x28);
  __s[0x2a] = (_func_int *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<ConstHoisting>();
  }